

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O0

int space_mixer_set(uint32_t field,void *value,mixed_segment *segment)

{
  space_mixer_data *data_00;
  int iVar1;
  mixed_channel_configuration *__src;
  mixed_buffer **ppmVar2;
  float *parts;
  space_mixer_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  data_00 = (space_mixer_data *)segment->data;
  switch(field) {
  case 3:
    data_00->volume = *value;
    break;
  default:
    mixed_err(7);
    return 0;
  case 0xc:
    if (((((data_00->location[0] != *value) || (NAN(data_00->location[0]) || NAN(*value))) ||
         (data_00->location[1] != *(float *)((long)value + 4))) ||
        ((NAN(data_00->location[1]) || NAN(*(float *)((long)value + 4)) ||
         (data_00->location[2] != *(float *)((long)value + 8))))) ||
       (NAN(data_00->location[2]) || NAN(*(float *)((long)value + 8)))) {
      data_00->location[0] = *value;
      data_00->location[1] = *(float *)((long)value + 4);
      data_00->location[2] = *(float *)((long)value + 8);
      mark_sources_dirty(data_00);
    }
    break;
  case 0xd:
    if (((data_00->direction[0] != *value) || (NAN(data_00->direction[0]) || NAN(*value))) ||
       (((data_00->direction[1] != *(float *)((long)value + 4) ||
         ((NAN(data_00->direction[1]) || NAN(*(float *)((long)value + 4)) ||
          (data_00->direction[2] != *(float *)((long)value + 8))))) ||
        (NAN(data_00->direction[2]) || NAN(*(float *)((long)value + 8)))))) {
      data_00->direction[0] = *value;
      data_00->direction[1] = *(float *)((long)value + 4);
      data_00->direction[2] = *(float *)((long)value + 8);
      recompute_look_at(data_00);
      mark_sources_dirty(data_00);
    }
    break;
  case 0xe:
    if (((data_00->velocity[0] != *value) || (NAN(data_00->velocity[0]) || NAN(*value))) ||
       ((data_00->velocity[1] != *(float *)((long)value + 4) ||
        (((NAN(data_00->velocity[1]) || NAN(*(float *)((long)value + 4)) ||
          (data_00->velocity[2] != *(float *)((long)value + 8))) ||
         (NAN(data_00->velocity[2]) || NAN(*(float *)((long)value + 8)))))))) {
      data_00->velocity[0] = *value;
      data_00->velocity[1] = *(float *)((long)value + 4);
      data_00->velocity[2] = *(float *)((long)value + 8);
      mark_sources_dirty(data_00);
    }
    break;
  case 0xf:
    if ((((data_00->up[0] != *value) || (NAN(data_00->up[0]) || NAN(*value))) ||
        (data_00->up[1] != *(float *)((long)value + 4))) ||
       (((NAN(data_00->up[1]) || NAN(*(float *)((long)value + 4)) ||
         (data_00->up[2] != *(float *)((long)value + 8))) ||
        (NAN(data_00->up[2]) || NAN(*(float *)((long)value + 8)))))) {
      data_00->up[0] = *value;
      data_00->up[1] = *(float *)((long)value + 4);
      data_00->up[2] = *(float *)((long)value + 8);
      recompute_look_at(data_00);
      mark_sources_dirty(data_00);
    }
    break;
  case 0x10:
    data_00->soundspeed = *value;
    mark_sources_dirty(data_00);
    break;
  case 0x11:
    data_00->doppler_factor = *value;
    mark_sources_dirty(data_00);
    break;
  case 0x12:
    data_00->min_distance = *value;
    mark_sources_dirty(data_00);
    break;
  case 0x13:
    data_00->max_distance = *value;
    mark_sources_dirty(data_00);
    break;
  case 0x14:
    data_00->rolloff = *value;
    mark_sources_dirty(data_00);
    break;
  case 0x15:
    switch(*value) {
    case 1:
      data_00->attenuation = attenuation_none;
      break;
    case 2:
      data_00->attenuation = attenuation_inverse;
      break;
    case 3:
      data_00->attenuation = attenuation_linear;
      break;
    case 4:
      data_00->attenuation = attenuation_exponential;
      break;
    default:
      data_00->attenuation = (_func_float_float_float_float_float *)value;
    }
    mark_sources_dirty(data_00);
    break;
  case 0x25:
    __src = mixed_default_channel_configuration((mixed_channel_t)*value);
    memcpy(&data_00->channels,__src,0x22);
    iVar1 = make_vbap_from_configuration(&data_00->channels,&data_00->vbap);
    if (iVar1 == 0) {
      return 0;
    }
    ppmVar2 = (mixed_buffer **)(*mixed_realloc)(data_00->out,(ulong)(data_00->channels).count << 3);
    data_00->out = ppmVar2;
    if (data_00->out == (mixed_buffer **)0x0) {
      mixed_err(1);
      return 0;
    }
    iVar1 = mixed_configuration_is_surround(&data_00->channels);
    data_00->surround = iVar1 != 0;
    mark_sources_dirty(data_00);
    break;
  case 0x3d:
    memcpy(&data_00->channels,value,0x22);
    iVar1 = make_vbap_from_configuration(&data_00->channels,&data_00->vbap);
    if (iVar1 == 0) {
      return 0;
    }
    ppmVar2 = (mixed_buffer **)(*mixed_realloc)(data_00->out,(ulong)(data_00->channels).count << 3);
    data_00->out = ppmVar2;
    if (data_00->out == (mixed_buffer **)0x0) {
      mixed_err(1);
      return 0;
    }
    iVar1 = mixed_configuration_is_surround(&data_00->channels);
    data_00->surround = iVar1 != 0;
    mark_sources_dirty(data_00);
  }
  return 1;
}

Assistant:

int space_mixer_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  float *parts = (float *)value;
  switch(field){
  case MIXED_VOLUME:
    data->volume = *((float *)value);
    break;
  case MIXED_SPACE_LOCATION:
    if(data->location[0] != parts[0] ||
       data->location[1] != parts[1] ||
       data->location[2] != parts[2]){
      data->location[0] = parts[0];
      data->location[1] = parts[1];
      data->location[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_VELOCITY:
    if(data->velocity[0] != parts[0] ||
       data->velocity[1] != parts[1] ||
       data->velocity[2] != parts[2]){
      data->velocity[0] = parts[0];
      data->velocity[1] = parts[1];
      data->velocity[2] = parts[2];
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_DIRECTION:
    if(data->direction[0] != parts[0] ||
       data->direction[1] != parts[1] ||
       data->direction[2] != parts[2]){
      data->direction[0] = parts[0];
      data->direction[1] = parts[1];
      data->direction[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_UP:
    if(data->up[0] != parts[0] ||
       data->up[1] != parts[1] ||
       data->up[2] != parts[2]){
      data->up[0] = parts[0];
      data->up[1] = parts[1];
      data->up[2] = parts[2];
      recompute_look_at(data);
      mark_sources_dirty(data);
    }
    break;
  case MIXED_SPACE_SOUNDSPEED:
    data->soundspeed = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_DOPPLER_FACTOR:
    data->doppler_factor = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MIN_DISTANCE:
    data->min_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_MAX_DISTANCE:
    data->max_distance = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ROLLOFF:
    data->rolloff = *(float *)value;
    mark_sources_dirty(data);
    break;
  case MIXED_SPACE_ATTENUATION:
    switch(*(uint32_t *)value){
    case MIXED_NO_ATTENUATION:
      data->attenuation = attenuation_none;
      break;
    case MIXED_INVERSE_ATTENUATION:
      data->attenuation = attenuation_inverse;
      break;
    case MIXED_LINEAR_ATTENUATION:
      data->attenuation = attenuation_linear;
      break;
    case MIXED_EXPONENTIAL_ATTENUATION:
      data->attenuation = attenuation_exponential;
      break;
    default:
      data->attenuation = (float (*)(float min, float max, float dist, float roll))value;
      break;
    }
    mark_sources_dirty(data);
    break;
  case MIXED_OUT_COUNT:
    memcpy(&data->channels, mixed_default_channel_configuration(*(uint32_t *)value), sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  case MIXED_CHANNEL_CONFIGURATION:
    memcpy(&data->channels, (struct mixed_channel_configuration *)value, sizeof(struct mixed_channel_configuration));
    if(!make_vbap_from_configuration(&data->channels, &data->vbap)) return 0;
    data->out = mixed_realloc(data->out, data->channels.count*sizeof(struct mixed_buffer *));
    if(!data->out){
      mixed_err(MIXED_OUT_OF_MEMORY);
      return 0;
    }
    data->surround = mixed_configuration_is_surround(&data->channels);
    mark_sources_dirty(data);
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}